

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

string * __thiscall
deqp::RobustBufferAccessBehavior::VertexBufferObjectsTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,VertexBufferObjectsTest *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430 core\n\nlayout (location = 0) in vec4 in_vs_position;\n\nvoid main()\n{\n    gl_Position = in_vs_position;\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string VertexBufferObjectsTest::getVertexShader()
{
	return std::string("#version 430 core\n"
					   "\n"
					   "layout (location = 0) in vec4 in_vs_position;\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = in_vs_position;\n"
					   "}\n"
					   "\n");
}